

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

bool __thiscall
Centaurus::NFA<unsigned_char>::epsilon_closure_sub
          (NFA<unsigned_char> *this,set<int,_std::less<int>,_std::allocator<int>_> *closure,
          int index)

{
  bool bVar1;
  pointer piVar2;
  bool long_flag;
  IndexVector et;
  bool local_4d;
  int local_4c;
  IndexVector local_48;
  
  local_4c = index;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)closure,
             &local_4c);
  local_4d = false;
  NFABaseState<unsigned_char,_int>::epsilon_transitions
            (&local_48,
             (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_4c,&local_4d);
  for (piVar2 = local_48.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; bVar1 = local_4d,
      piVar2 != local_48.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    bVar1 = epsilon_closure_sub(this,closure,*piVar2);
    local_4d = (bool)(local_4d | bVar1);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_48.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

bool epsilon_closure_sub(std::set<int>& closure, int index) const
    {
        //Always include myself
        closure.insert(index);

        bool long_flag = false;
        IndexVector et = m_states[index].epsilon_transitions(long_flag);

        for (int dest : et)
        {
            long_flag |= epsilon_closure_sub(closure, dest);
        }
        return long_flag;
    }